

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int iVar3;
  ImGuiContext *g;
  int iVar4;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar2 = GImGui->CurrentWindow;
    pbVar7 = &GImGui->CurrentTable->HostSkipItems;
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar7 = &pIVar2->SkipItems;
    }
    if (*pbVar7 == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar9 = (pIVar2->ClipRect).Min.y;
    fVar10 = (pIVar2->ClipRect).Max.y;
    bVar1 = GImGui->NavMoveScoringItems;
    fVar8 = fVar10;
    if (bVar1 == true) {
      fVar11 = (GImGui->NavScoringRect).Min.y;
      fVar8 = (GImGui->NavScoringRect).Max.y;
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
      if (fVar8 <= fVar10) {
        fVar8 = fVar10;
      }
    }
    fVar10 = fVar8;
    if ((GImGui->NavJustMovedToId != 0) && (pIVar2->NavLastIds[0] == GImGui->NavJustMovedToId)) {
      fVar10 = (pIVar2->Pos).y;
      fVar11 = pIVar2->NavRectRel[0].Min.y + fVar10;
      fVar10 = fVar10 + pIVar2->NavRectRel[0].Max.y;
      if (fVar9 <= fVar11) {
        fVar11 = fVar9;
      }
      fVar9 = fVar11;
      if (fVar10 <= fVar8) {
        fVar10 = fVar8;
      }
    }
    fVar8 = (pIVar2->DC).CursorPos.y;
    iVar5 = (int)((fVar9 - fVar8) / items_height);
    if (bVar1 != false) {
      iVar5 = iVar5 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar6 = (int)((fVar10 - fVar8) / items_height);
    if (bVar1 != false) {
      iVar6 = iVar6 + (uint)(GImGui->NavMoveClipDir == 3);
    }
    iVar3 = items_count;
    if (iVar5 < items_count) {
      iVar3 = iVar5;
    }
    iVar4 = 0;
    if (-1 < iVar5) {
      iVar4 = iVar3;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 < items_count) {
      items_count = iVar6;
    }
    if (iVar6 < iVar4) {
      items_count = iVar4;
    }
    *out_items_display_start = iVar4;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (GetSkipItemForListClipping())
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the scoring rect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveScoringItems)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max)); // Could store and use NavJustMovedToRectRel

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveScoringItems && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}